

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O1

int CfdParseConfidentialAddress
              (void *handle,char *confidential_address,char **address,char **confidential_key,
              int *network_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  CfdException *this;
  char *work_confidential_key;
  char *work_address;
  ElementsAddressFactory factory;
  Address addr;
  ElementsConfidentialAddress confidential_addr;
  char *local_400;
  char *local_3f8;
  string local_3f0;
  ConfidentialKey local_3d0;
  ElementsAddressFactory local_3b8;
  ElementsConfidentialAddress local_390;
  ElementsConfidentialAddress local_1e0;
  
  local_3f8 = (char *)0x0;
  local_400 = (char *)0x0;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(confidential_address);
  if (!bVar2) {
    cfd::ElementsAddressFactory::ElementsAddressFactory(&local_3b8);
    cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_1e0);
    std::__cxx11::string::string((string *)&local_3f0,confidential_address,(allocator *)&local_3d0);
    cfd::ElementsAddressFactory::GetConfidentialAddress(&local_390,&local_3b8,&local_3f0);
    cfd::core::ElementsConfidentialAddress::operator=(&local_1e0,&local_390);
    cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_390);
    paVar1 = &local_3f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
              (&local_390.unblinded_address_,&local_1e0);
    if (network_type != (int *)0x0) {
      iVar3 = cfd::capi::ConvertFromCfdNetType(local_390.unblinded_address_.type_);
      *network_type = iVar3;
    }
    if (address != (char **)0x0) {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_3f0,&local_390.unblinded_address_);
      local_3f8 = cfd::capi::CreateString(&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f0._M_dataplus._M_p);
      }
    }
    if (confidential_key != (char **)0x0) {
      cfd::core::ElementsConfidentialAddress::GetConfidentialKey(&local_3d0,&local_1e0);
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_3f0,&local_3d0);
      local_400 = cfd::capi::CreateString(&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f0._M_dataplus._M_p);
      }
      if (local_3d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_3f8 != (char *)0x0) {
      *address = local_3f8;
    }
    if (local_400 != (char *)0x0) {
      *confidential_key = local_400;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_390.unblinded_address_.format_data_);
    cfd::core::Script::~Script(&local_390.unblinded_address_.redeem_script_);
    local_390.unblinded_address_.script_tree_.super_TapBranch._vptr_TapBranch =
         (_func_int **)&PTR__TaprootScriptTree_00740b18;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_390.unblinded_address_.script_tree_.nodes_);
    cfd::core::TapBranch::~TapBranch(&local_390.unblinded_address_.script_tree_.super_TapBranch);
    if (local_390.unblinded_address_.schnorr_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_390.unblinded_address_.schnorr_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_390.unblinded_address_.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_390.unblinded_address_.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_390.unblinded_address_.hash_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_390.unblinded_address_.hash_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390.unblinded_address_.address_._M_dataplus._M_p !=
        &local_390.unblinded_address_.address_.field_2) {
      operator_delete(local_390.unblinded_address_.address_._M_dataplus._M_p);
    }
    cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_1e0);
    local_3b8.super_AddressFactory._vptr_AddressFactory =
         (_func_int **)&PTR__AddressFactory_00733578;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_3b8.super_AddressFactory.prefix_list_);
    return 0;
  }
  local_1e0.unblinded_address_._0_8_ = "cfdcapi_elements_address.cpp";
  local_1e0.unblinded_address_.witness_ver_ = 0x77;
  local_1e0.unblinded_address_.address_._M_dataplus._M_p = "CfdParseConfidentialAddress";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_1e0,kCfdLogLevelWarning,
             "confidential address is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_1e0.unblinded_address_._0_8_ = &local_1e0.unblinded_address_.address_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,"Failed to parameter. confidential address is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_1e0);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdParseConfidentialAddress(
    void* handle, const char* confidential_address, char** address,
    char** confidential_key, int* network_type) {
  char* work_address = nullptr;
  char* work_confidential_key = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(confidential_address)) {
      warn(CFD_LOG_SOURCE, "confidential address is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential address is null or empty.");
    }

    ElementsAddressFactory factory;
    ElementsConfidentialAddress confidential_addr;
    confidential_addr = factory.GetConfidentialAddress(confidential_address);
    Address addr = confidential_addr.GetUnblindedAddress();
    if (network_type != nullptr) {
      // convert to c_network_type
      *network_type = ConvertFromCfdNetType(addr.GetNetType());
    }
    if (address != nullptr) {
      work_address = CreateString(addr.GetAddress());
    }
    if (confidential_key != nullptr) {
      work_confidential_key =
          CreateString(confidential_addr.GetConfidentialKey().GetHex());
    }

    if (work_address != nullptr) *address = work_address;
    if (work_confidential_key != nullptr)
      *confidential_key = work_confidential_key;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_address, &work_confidential_key);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}